

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vmsumuhm_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  int i;
  long lVar1;
  bool bVar2;
  uint32_t prod [8];
  
  lVar1 = 0;
  do {
    prod[lVar1] = (uint)b->u16[lVar1] * (uint)a->u16[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 3;
  do {
    r->u32[lVar1] = prod[lVar1 * 2] + c->u32[lVar1] + prod[lVar1 * 2 + 1];
    bVar2 = lVar1 != 0;
    lVar1 = lVar1 + -1;
  } while (bVar2);
  return;
}

Assistant:

void helper_vmsumuhm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, u32) {
        r->u32[i] = c->u32[i] + prod[2 * i] + prod[2 * i + 1];
    }
}